

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void reuse_with_snapshot_test(void)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  int iVar3;
  char *pcVar4;
  fdb_status s_13;
  fdb_status s_12;
  fdb_status s_11;
  fdb_status s_10;
  fdb_status s_9;
  fdb_status s_8;
  fdb_status s_7;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  fdb_status s_1;
  fdb_status s;
  fdb_config fconfig;
  fdb_file_info file_info;
  sb_decision_t sb_decision;
  fdb_kvs_config kvs_config;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_status status;
  size_t rvalue_len;
  void *rvalue;
  char bodybuf [512];
  char keybuf [512];
  int kv;
  int r;
  int n;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffff858;
  fdb_file_handle *in_stack_fffffffffffff860;
  FILE *pFVar5;
  undefined4 in_stack_fffffffffffff878;
  undefined4 in_stack_fffffffffffff87c;
  void **in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff88c;
  fdb_file_info *in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff89c;
  fdb_config *in_stack_fffffffffffffa78;
  char *in_stack_fffffffffffffa80;
  fdb_file_handle **in_stack_fffffffffffffa88;
  fdb_seqnum_t in_stack_fffffffffffffb00;
  fdb_kvs_handle **in_stack_fffffffffffffb08;
  fdb_kvs_handle *in_stack_fffffffffffffb10;
  ulong local_4d8;
  size_t local_478;
  void *local_470;
  char local_468 [512];
  char local_268 [520];
  undefined4 local_60;
  int local_5c;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  local_60 = 0x200;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  local_5c = system("rm -rf  staleblktest* > errorlog.txt");
  fdb_open(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  fdb_kvs_open_default
            (in_stack_fffffffffffff860,(fdb_kvs_handle **)in_stack_fffffffffffff858,
             (fdb_kvs_config *)0x10531e);
  local_58 = 0x14;
  for (local_54 = 0; (int)local_54 < local_58; local_54 = local_54 + 1) {
    fillstr(local_268,'k',0x200);
    sprintf(local_468,"orig_body%d",(ulong)(local_54 + 1));
    strlen(local_268);
    strlen(local_468);
    fVar1 = fdb_set_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       in_stack_fffffffffffff890,
                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                       in_stack_fffffffffffff880,
                       CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0xf4);
      reuse_with_snapshot_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0xf4,"void reuse_with_snapshot_test()");
    }
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff858,'\0');
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0xf6);
      reuse_with_snapshot_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0xf6,"void reuse_with_snapshot_test()");
    }
  }
  local_54 = 0;
  do {
    fillstr(local_268,'r',0x200);
    fillstr(local_468,'y',0x200);
    strlen(local_268);
    strlen(local_468);
    fVar1 = fdb_set_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       in_stack_fffffffffffff890,
                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                       in_stack_fffffffffffff880,
                       CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x100);
      reuse_with_snapshot_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x100,"void reuse_with_snapshot_test()");
    }
    local_54 = local_54 + 1;
    fVar1 = fdb_get_file_info((fdb_file_handle *)
                              CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                              in_stack_fffffffffffff890);
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x103);
      reuse_with_snapshot_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x103,"void reuse_with_snapshot_test()");
    }
  } while (local_4d8 < 0x1000000);
  sVar2 = sb_check_block_reusing
                    ((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888)
                    );
  if (sVar2 != SBD_RECLAIM) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x107);
    reuse_with_snapshot_test::__test_pass = 0;
    if (sVar2 != SBD_RECLAIM) {
      __assert_fail("sb_decision == SBD_RECLAIM",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x107,"void reuse_with_snapshot_test()");
    }
  }
  fVar1 = fdb_snapshot_open(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                            in_stack_fffffffffffffb00);
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x10b);
    reuse_with_snapshot_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x10b,"void reuse_with_snapshot_test()");
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff858,'\0');
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x10f);
    reuse_with_snapshot_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x10f,"void reuse_with_snapshot_test()");
  }
  local_54 = 0;
  do {
    sprintf(local_268,"key%d",(ulong)local_54);
    fillstr(local_468,'z',0x200);
    strlen(local_268);
    strlen(local_468);
    fVar1 = fdb_set_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       in_stack_fffffffffffff890,
                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                       in_stack_fffffffffffff880,
                       CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x118);
      reuse_with_snapshot_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x118,"void reuse_with_snapshot_test()");
    }
    sVar2 = sb_check_block_reusing
                      ((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    local_54 = local_54 + 1;
  } while (sVar2 != SBD_NONE);
  local_58 = 0x14;
  for (local_54 = 0; (int)local_54 < local_58; local_54 = local_54 + 1) {
    fillstr(local_268,'k',0x200);
    strlen(local_268);
    fVar1 = fdb_del_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                       in_stack_fffffffffffff880,
                       CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x122);
      reuse_with_snapshot_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x122,"void reuse_with_snapshot_test()");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff858,'\0');
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x127);
    reuse_with_snapshot_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x127,"void reuse_with_snapshot_test()");
  }
  fillstr(local_268,'k',0x200);
  sprintf(local_468,"orig_body%d",8);
  strlen(local_268);
  fVar1 = fdb_get_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898)
                     ,in_stack_fffffffffffff890,
                     CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                     in_stack_fffffffffffff880,
                     (size_t *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x12f);
    reuse_with_snapshot_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x12f,"void reuse_with_snapshot_test()");
    }
  }
  strlen(local_268);
  fVar1 = fdb_get_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898)
                     ,in_stack_fffffffffffff890,
                     CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888),
                     in_stack_fffffffffffff880,
                     (size_t *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  pFVar5 = _stderr;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    iVar3 = memcmp(local_470,local_468,local_478);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_468,local_470,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x135);
      reuse_with_snapshot_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x135,"void reuse_with_snapshot_test()");
    }
    fVar1 = fdb_free_block((void *)0x105f7c);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar5 = _stderr;
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x138);
      reuse_with_snapshot_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x138,"void reuse_with_snapshot_test()");
    }
    fVar1 = fdb_kvs_close(in_stack_fffffffffffff858);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar5 = _stderr;
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x13a);
      reuse_with_snapshot_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x13a,"void reuse_with_snapshot_test()");
    }
    fVar1 = fdb_kvs_close(in_stack_fffffffffffff858);
    pFVar5 = _stderr;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffff858);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        if (reuse_with_snapshot_test::__test_pass == 0) {
          fprintf(_stderr,"%s FAILED\n","reuse with snapshot test");
        }
        else {
          fprintf(_stderr,"%s PASSED\n","reuse with snapshot test");
        }
        return;
      }
      pFVar5 = _stderr;
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x13e);
      reuse_with_snapshot_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x13e,"void reuse_with_snapshot_test()");
    }
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x13c);
    reuse_with_snapshot_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x13c,"void reuse_with_snapshot_test()");
  }
  pcVar4 = fdb_error_msg(fVar1);
  fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x134);
  reuse_with_snapshot_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x134,"void reuse_with_snapshot_test()");
}

Assistant:

void reuse_with_snapshot_test() {
    TEST_INIT();
    memleak_start();

    int i, n, r;
    const int kv = 512;
    char keybuf[kv];
    char bodybuf[kv];
    void *rvalue;
    size_t rvalue_len;
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = 10;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create 2*num_keeping_headers
    n = 2 * fconfig.num_keeping_headers;
    for (i = 0; i < n; i++) {
        fillstr(keybuf, 'k', kv);
        sprintf(bodybuf, "orig_body%d", i+1);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf) + 1);
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        fillstr(keybuf, 'r', kv);
        fillstr(bodybuf, 'y', kv);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);

    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // open snapshot
    status = fdb_snapshot_open(db, &snap_db, 8);
    TEST_STATUS(status);

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // write until blocks are no longer being reused
    i = 0;
    do {
        sprintf(keybuf, "key%d", i);
        fillstr(bodybuf, 'z', kv);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        sb_decision = sb_check_block_reusing(db);
        i++;
    } while (sb_decision != SBD_NONE);

    // delete original keys
    n = 2 * fconfig.num_keeping_headers;
    for (i = 0; i < n; i++) {
        fillstr(keybuf, 'k', kv);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_STATUS(status);
    }

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    fillstr(keybuf, 'k', kv);
    sprintf(bodybuf, "orig_body%d", 8);

    // check key does not exist in main kv
    status = fdb_get_kv(db, keybuf, strlen(keybuf),
                        &rvalue, &rvalue_len);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    // check still exists in snapshot data
    status = fdb_get_kv(snap_db, keybuf, strlen(keybuf),
                        &rvalue, &rvalue_len);
    TEST_STATUS(status);
    TEST_CMP(rvalue, bodybuf, rvalue_len);

    status = fdb_free_block(rvalue);
    TEST_STATUS(status);
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("reuse with snapshot test");
}